

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallelepiped.cpp
# Opt level: O0

void __thiscall Parallelepiped::_calculateTriangles(Parallelepiped *this)

{
  ColorRGB *pCVar1;
  Triangle *pTVar2;
  tvec3<float> local_364;
  tvec3<float> local_358;
  tvec3<float> local_34c;
  Triangle *local_340;
  undefined8 local_338;
  float local_330;
  undefined8 local_328;
  float local_320;
  tvec3<float> local_31c;
  tvec3<float> local_310;
  tvec3<float> local_304;
  Triangle *local_2f8;
  undefined8 local_2f0;
  float local_2e8;
  undefined8 local_2e0;
  float local_2d8;
  tvec3<float> local_2d4;
  tvec3<float> local_2c8;
  tvec3<float> local_2bc;
  Triangle *local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  tvec3<float> local_28c;
  tvec3<float> local_280;
  tvec3<float> local_274;
  Triangle *local_268;
  undefined8 local_260;
  float local_258;
  undefined8 local_250;
  float local_248;
  tvec3<float> local_244;
  tvec3<float> local_238;
  tvec3<float> local_22c;
  Triangle *local_220;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  tvec3<float> local_1fc;
  tvec3<float> local_1f0;
  tvec3<float> local_1e4;
  Triangle *local_1d8;
  undefined8 local_1d0;
  float local_1c8;
  undefined8 local_1c0;
  float local_1b8;
  tvec3<float> local_1b4;
  tvec3<float> local_1a8;
  tvec3<float> local_19c;
  Triangle *local_190;
  undefined8 local_188;
  float local_180;
  undefined8 local_178;
  float local_170;
  tvec3<float> local_16c;
  tvec3<float> local_160;
  tvec3<float> local_154;
  Triangle *local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  tvec3<float> local_124;
  tvec3<float> local_118;
  tvec3<float> local_10c;
  Triangle *local_100;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  tvec3<float> local_dc;
  tvec3<float> local_d0;
  tvec3<float> local_c4;
  Triangle *local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  tvec3<float> local_94;
  tvec3<float> local_88;
  tvec3<float> local_7c;
  Triangle *local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  tvec3<float> local_4c;
  tvec3<float> local_40 [2];
  tvec3<float> local_24;
  Triangle *local_18;
  Parallelepiped *local_10;
  Parallelepiped *this_local;
  
  local_10 = this;
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_24,&this->v0);
  glm::detail::tvec3<float>::tvec3(local_40,&this->v1);
  glm::detail::tvec3<float>::tvec3(&local_4c,&this->v2);
  local_60 = (this->super_SceneObject).color.b;
  pCVar1 = &(this->super_SceneObject).color;
  local_68._0_4_ = pCVar1->r;
  local_68._4_4_ = pCVar1->g;
  local_58 = local_68;
  local_50 = local_60;
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_24,local_40,&local_4c,
                     *pCVar1);
  local_18 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_18);
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_7c,&this->v1);
  glm::detail::tvec3<float>::tvec3(&local_88,&this->v3);
  glm::detail::tvec3<float>::tvec3(&local_94,&this->v2);
  local_a8 = (this->super_SceneObject).color.b;
  pCVar1 = &(this->super_SceneObject).color;
  local_b0._0_4_ = pCVar1->r;
  local_b0._4_4_ = pCVar1->g;
  local_a0 = local_b0;
  local_98 = local_a8;
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_7c,&local_88,&local_94,
                     *pCVar1);
  local_70 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_70);
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_c4,&this->v0);
  glm::detail::tvec3<float>::tvec3(&local_d0,&this->v4);
  glm::detail::tvec3<float>::tvec3(&local_dc,&this->v1);
  local_f0 = (this->super_SceneObject).color.b;
  pCVar1 = &(this->super_SceneObject).color;
  local_f8._0_4_ = pCVar1->r;
  local_f8._4_4_ = pCVar1->g;
  local_e8 = local_f8;
  local_e0 = local_f0;
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_c4,&local_d0,&local_dc,
                     *pCVar1);
  local_b8 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_b8);
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_10c,&this->v1);
  glm::detail::tvec3<float>::tvec3(&local_118,&this->v4);
  glm::detail::tvec3<float>::tvec3(&local_124,&this->v5);
  local_138 = (this->super_SceneObject).color.b;
  pCVar1 = &(this->super_SceneObject).color;
  local_140._0_4_ = pCVar1->r;
  local_140._4_4_ = pCVar1->g;
  local_130 = local_140;
  local_128 = local_138;
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_10c,&local_118,&local_124
                     ,*pCVar1);
  local_100 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_100);
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_154,&this->v0);
  glm::detail::tvec3<float>::tvec3(&local_160,&this->v2);
  glm::detail::tvec3<float>::tvec3(&local_16c,&this->v4);
  local_180 = (this->super_SceneObject).color.b;
  pCVar1 = &(this->super_SceneObject).color;
  local_188._0_4_ = pCVar1->r;
  local_188._4_4_ = pCVar1->g;
  local_178 = local_188;
  local_170 = local_180;
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_154,&local_160,&local_16c
                     ,*pCVar1);
  local_148 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_148);
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_19c,&this->v2);
  glm::detail::tvec3<float>::tvec3(&local_1a8,&this->v6);
  glm::detail::tvec3<float>::tvec3(&local_1b4,&this->v4);
  local_1c8 = (this->super_SceneObject).color.b;
  pCVar1 = &(this->super_SceneObject).color;
  local_1d0._0_4_ = pCVar1->r;
  local_1d0._4_4_ = pCVar1->g;
  local_1c0 = local_1d0;
  local_1b8 = local_1c8;
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_19c,&local_1a8,&local_1b4
                     ,*pCVar1);
  local_190 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_190);
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_1e4,&this->v1);
  glm::detail::tvec3<float>::tvec3(&local_1f0,&this->v5);
  glm::detail::tvec3<float>::tvec3(&local_1fc,&this->v3);
  local_210 = (this->super_SceneObject).color.b;
  pCVar1 = &(this->super_SceneObject).color;
  local_218._0_4_ = pCVar1->r;
  local_218._4_4_ = pCVar1->g;
  local_208 = local_218;
  local_200 = local_210;
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_1e4,&local_1f0,&local_1fc
                     ,*pCVar1);
  local_1d8 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_1d8);
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_22c,&this->v3);
  glm::detail::tvec3<float>::tvec3(&local_238,&this->v5);
  glm::detail::tvec3<float>::tvec3(&local_244,&this->v7);
  local_258 = (this->super_SceneObject).color.b;
  pCVar1 = &(this->super_SceneObject).color;
  local_260._0_4_ = pCVar1->r;
  local_260._4_4_ = pCVar1->g;
  local_250 = local_260;
  local_248 = local_258;
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_22c,&local_238,&local_244
                     ,*pCVar1);
  local_220 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_220);
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_274,&this->v2);
  glm::detail::tvec3<float>::tvec3(&local_280,&this->v3);
  glm::detail::tvec3<float>::tvec3(&local_28c,&this->v6);
  local_2a0 = (this->super_SceneObject).color.b;
  pCVar1 = &(this->super_SceneObject).color;
  local_2a8._0_4_ = pCVar1->r;
  local_2a8._4_4_ = pCVar1->g;
  local_298 = local_2a8;
  local_290 = local_2a0;
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_274,&local_280,&local_28c
                     ,*pCVar1);
  local_268 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_268);
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_2bc,&this->v3);
  glm::detail::tvec3<float>::tvec3(&local_2c8,&this->v7);
  glm::detail::tvec3<float>::tvec3(&local_2d4,&this->v6);
  local_2e8 = (this->super_SceneObject).color.b;
  pCVar1 = &(this->super_SceneObject).color;
  local_2f0._0_4_ = pCVar1->r;
  local_2f0._4_4_ = pCVar1->g;
  local_2e0 = local_2f0;
  local_2d8 = local_2e8;
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_2bc,&local_2c8,&local_2d4
                     ,*pCVar1);
  local_2b0 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_2b0);
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_304,&this->v4);
  glm::detail::tvec3<float>::tvec3(&local_310,&this->v6);
  glm::detail::tvec3<float>::tvec3(&local_31c,&this->v5);
  local_330 = (this->super_SceneObject).color.b;
  pCVar1 = &(this->super_SceneObject).color;
  local_338._0_4_ = pCVar1->r;
  local_338._4_4_ = pCVar1->g;
  local_328 = local_338;
  local_320 = local_330;
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_304,&local_310,&local_31c
                     ,*pCVar1);
  local_2f8 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_2f8);
  pTVar2 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_34c,&this->v5);
  glm::detail::tvec3<float>::tvec3(&local_358,&this->v6);
  glm::detail::tvec3<float>::tvec3(&local_364,&this->v7);
  Triangle::Triangle(pTVar2,&(this->super_SceneObject).localToWorld,&local_34c,&local_358,&local_364
                     ,(this->super_SceneObject).color);
  local_340 = pTVar2;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_340);
  return;
}

Assistant:

void Parallelepiped::_calculateTriangles() {
    //front
    triangles.push_back(new Triangle(localToWorld, v0, v1, v2, color));
    triangles.push_back(new Triangle(localToWorld, v1, v3, v2, color));
    
    //bottom
    triangles.push_back(new Triangle(localToWorld, v0, v4, v1, color));
    triangles.push_back(new Triangle(localToWorld, v1, v4, v5, color));
    
    //left
    triangles.push_back(new Triangle(localToWorld, v0, v2, v4, color));
    triangles.push_back(new Triangle(localToWorld, v2, v6, v4, color));
    
    //right
    triangles.push_back(new Triangle(localToWorld, v1, v5, v3, color));
    triangles.push_back(new Triangle(localToWorld, v3, v5, v7, color));
    
    //top
    triangles.push_back(new Triangle(localToWorld, v2, v3, v6, color));
    triangles.push_back(new Triangle(localToWorld, v3, v7, v6, color));
    
    //back
    triangles.push_back(new Triangle(localToWorld, v4, v6, v5, color));
    triangles.push_back(new Triangle(localToWorld, v5, v6, v7, color));
}